

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<double,__1,__1> * __thiscall
Matrix<double,_-1,_-1>::operator=(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> matrix)

{
  double *pdVar1;
  int row;
  ulong uVar2;
  int col;
  Matrix<double,__1,__1> local_38;
  double local_28;
  
  local_38.data = matrix.data;
  local_38._0_8_ = matrix._0_8_;
  if (&local_38 != this) {
    if (this->data != (double *)0x0) {
      operator_delete__(this->data);
    }
    this->cols = local_38.cols;
    this->rows = local_38.rows;
    uVar2 = 0xffffffffffffffff;
    if (-1 < local_38.rows * local_38.cols) {
      uVar2 = (long)(local_38.rows * local_38.cols) * 8;
    }
    pdVar1 = (double *)operator_new__(uVar2);
    this->data = pdVar1;
    if (0 < local_38.rows) {
      row = 0;
      do {
        if (0 < local_38.cols) {
          col = 0;
          do {
            pdVar1 = operator()(&local_38,row,col);
            local_28 = *pdVar1;
            pdVar1 = operator()(this,row,col);
            *pdVar1 = local_28;
            col = col + 1;
          } while (col < local_38.cols);
        }
        row = row + 1;
      } while (row < local_38.rows);
    }
  }
  return this;
}

Assistant:

const Matrix<Type, _0, _1> & Matrix<Type, _0, _1>::operator= (const Matrix<Type, _0, _1> matrix)
{
    if(this == &matrix)
    {
        return *this;
    }
    if(this->data != NULL)
    {
        delete [] data;
    }

    this->cols = matrix.col();
    this->rows = matrix.row();
    this->data = new Type[matrix.col() * matrix.row()];
    for(int i = 0; i < matrix.row(); ++i)
       for(int j = 0; j < matrix.col(); ++j)
       {
            double tmp = matrix(i, j);
            this->operator()(i, j) = tmp;
       }
    
    return (*this);
}